

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O3

void Curl_llist_insert_next(curl_llist *list,curl_llist_element *e,void *p,curl_llist_element *ne)

{
  size_t sVar1;
  curl_llist *pcVar2;
  curl_llist *pcVar3;
  
  ne->ptr = p;
  sVar1 = list->size;
  if (sVar1 == 0) {
    list->head = ne;
    pcVar2 = (curl_llist *)&list->tail;
    ne->prev = (curl_llist_element *)0x0;
    ne->next = (curl_llist_element *)0x0;
  }
  else {
    pcVar2 = (curl_llist *)&e->next;
    pcVar3 = pcVar2;
    if (e == (curl_llist_element *)0x0) {
      pcVar3 = list;
    }
    ne->next = pcVar3->head;
    ne->prev = e;
    if (e == (curl_llist_element *)0x0) {
      list->head->prev = ne;
      pcVar2 = list;
    }
    else {
      pcVar3 = *(curl_llist **)pcVar2;
      if (*(curl_llist **)pcVar2 == (curl_llist *)0x0) {
        pcVar3 = list;
      }
      pcVar3->tail = ne;
    }
  }
  pcVar2->head = ne;
  list->size = sVar1 + 1;
  return;
}

Assistant:

void
Curl_llist_insert_next(struct curl_llist *list, struct curl_llist_element *e,
                       const void *p,
                       struct curl_llist_element *ne)
{
  ne->ptr = (void *) p;
  if(list->size == 0) {
    list->head = ne;
    list->head->prev = NULL;
    list->head->next = NULL;
    list->tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->next = e?e->next:list->head;
    ne->prev = e;
    if(!e) {
      list->head->prev = ne;
      list->head = ne;
    }
    else if(e->next) {
      e->next->prev = ne;
    }
    else {
      list->tail = ne;
    }
    if(e)
      e->next = ne;
  }

  ++list->size;
}